

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaGetNodeContent(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node)

{
  xmlChar *pxVar1;
  xmlChar *ret;
  xmlChar *val;
  xmlNodePtr node_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  ret = xmlNodeGetContent(node);
  if (ret == (xmlChar *)0x0) {
    ret = xmlStrdup("");
  }
  pxVar1 = xmlDictLookup(ctxt->dict,ret,-1);
  (*xmlFree)(ret);
  if (pxVar1 == (xmlChar *)0x0) {
    xmlSchemaPErrMemory(ctxt);
  }
  return pxVar1;
}

Assistant:

static const xmlChar *
xmlSchemaGetNodeContent(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlChar *val;
    const xmlChar *ret;

    val = xmlNodeGetContent(node);
    if (val == NULL)
	val = xmlStrdup((xmlChar *)"");
    ret = xmlDictLookup(ctxt->dict, val, -1);
    xmlFree(val);
    if (ret == NULL)
        xmlSchemaPErrMemory(ctxt);
    return(ret);
}